

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format.cpp
# Opt level: O0

void anon_unknown.dwarf_1f40::NumberCase(void)

{
  char *expected;
  string actual;
  string f;
  string *in_stack_00000150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000158;
  char **in_stack_00000160;
  allocator local_81;
  string local_80 [32];
  char *local_60;
  string local_58 [28];
  int in_stack_ffffffffffffffc4;
  string *in_stack_ffffffffffffffc8;
  allocator local_21;
  string local_20 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"Number: %05d",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  GPIO::format<int>(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  local_60 = "Number: 00072";
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",&local_81);
  assert::are_equal<char_const*,std::__cxx11::string>
            (in_stack_00000160,in_stack_00000158,in_stack_00000150);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_20);
  return;
}

Assistant:

void NumberCase()
    {
        std::string f = "Number: %05d";
        auto actual = GPIO::format(f, 72);
        auto expected = "Number: 00072";

        assert::are_equal(expected, actual);
    }